

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxsc.cpp
# Opt level: O3

void __thiscall ktxSupercompressor::validateOptions(ktxSupercompressor *this)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  
  scApp::validateOptions(&this->super_scApp);
  if (((ulong)((long)(this->options).super_commandOptions.super_commandOptions.infiles.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->options).super_commandOptions.super_commandOptions.infiles.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) < 0x21) ||
     ((this->options).super_commandOptions.super_commandOptions.outfile._M_string_length == 0)) {
    iVar1 = (this->options).super_commandOptions.etc1s;
    iVar2 = (this->options).super_commandOptions.zcmp;
    if (iVar2 == 0 || iVar1 == 0) {
      if (((iVar1 != 0 || (this->options).super_commandOptions.astc != 0) || iVar2 != 0) ||
         ((this->options).super_commandOptions.bopts.super_ktxBasisParams.uastc != false)) {
        return;
      }
      pcVar4 = "Must specify one of --zcmp, --etc1s (deprecated --bcmp) or --uastc.";
    }
    else {
      pcVar4 = "Can\'t encode to etc1s and supercompress with zstd.";
    }
  }
  else {
    pcVar4 = "Can\'t use -o when there are multiple infiles.";
  }
  poVar3 = std::operator<<((ostream *)&std::cerr,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
  (*(this->super_scApp).super_ktxApp._vptr_ktxApp[1])(this);
  exit(1);
}

Assistant:

void
ktxSupercompressor::validateOptions()
{
    scApp::validateOptions();

    if (options.infiles.size() > 1 && options.outfile.length()) {
        cerr << "Can't use -o when there are multiple infiles." << endl;
        usage();
        exit(1);
    }
    if (options.etc1s && options.zcmp) {
        cerr << "Can't encode to etc1s and supercompress with zstd." << endl;
        usage();
        exit(1);
    }
    if (!options.astc && !options.etc1s && !options.zcmp && !options.bopts.uastc) {
       cerr << "Must specify one of --zcmp, --etc1s (deprecated --bcmp) or --uastc." << endl;
       usage();
       exit(1);
    }
}